

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEScanPartialInternal<float,false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  undefined4 uVar1;
  uint uVar2;
  _func_int *p_Var3;
  idx_t iVar4;
  data_ptr_t pdVar5;
  _func_int **pp_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pointer pSVar10;
  ulong uVar11;
  ulong uVar12;
  _func_int **pp_Var13;
  _func_int **pp_Var14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar21;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar27;
  undefined1 auVar26 [16];
  
  pSVar10 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
            ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar10 + 3));
  p_Var3 = pSVar10[3]._vptr_SegmentScanState[2];
  iVar4 = segment->offset;
  uVar2 = *(uint *)&pSVar10[6]._vptr_SegmentScanState;
  pdVar5 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar9 = _DAT_01df8090;
  auVar8 = _DAT_01df8070;
  auVar7 = _DAT_01defe80;
  uVar18 = scan_count + result_offset;
  do {
    uVar11 = uVar18 - result_offset;
    if (uVar18 < result_offset || uVar11 == 0) {
      return;
    }
    pp_Var6 = pSVar10[4]._vptr_SegmentScanState;
    pp_Var13 = pSVar10[5]._vptr_SegmentScanState;
    pp_Var14 = (_func_int **)(ulong)*(ushort *)(p_Var3 + (long)pp_Var6 * 2 + uVar2 + iVar4);
    uVar12 = (long)pp_Var14 - (long)pp_Var13;
    uVar1 = *(undefined4 *)(p_Var3 + (long)pp_Var6 * 4 + iVar4 + 8);
    if (uVar11 < uVar12) {
      lVar15 = uVar11 + (uVar11 == 0);
      lVar16 = lVar15 + -1;
      auVar20._8_4_ = (int)lVar16;
      auVar20._0_8_ = lVar16;
      auVar20._12_4_ = (int)((ulong)lVar16 >> 0x20);
      lVar16 = result_offset * 4;
      auVar20 = auVar20 ^ auVar7;
      uVar17 = 0;
      auVar24 = auVar8;
      auVar26 = auVar9;
      do {
        auVar25 = auVar24 ^ auVar7;
        iVar21 = auVar20._4_4_;
        if ((bool)(~(auVar25._4_4_ == iVar21 && auVar20._0_4_ < auVar25._0_4_ ||
                    iVar21 < auVar25._4_4_) & 1)) {
          *(undefined4 *)(pdVar5 + uVar17 * 4 + lVar16) = uVar1;
        }
        if ((auVar25._12_4_ != auVar20._12_4_ || auVar25._8_4_ <= auVar20._8_4_) &&
            auVar25._12_4_ <= auVar20._12_4_) {
          *(undefined4 *)(pdVar5 + uVar17 * 4 + lVar16 + 4) = uVar1;
        }
        iVar27 = SUB164(auVar26 ^ auVar7,4);
        if (iVar27 <= iVar21 && (iVar27 != iVar21 || SUB164(auVar26 ^ auVar7,0) <= auVar20._0_4_)) {
          *(undefined4 *)(pdVar5 + uVar17 * 4 + lVar16 + 8) = uVar1;
          *(undefined4 *)(pdVar5 + uVar17 * 4 + lVar16 + 0xc) = uVar1;
        }
        uVar17 = uVar17 + 4;
        lVar22 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 4;
        auVar24._8_8_ = lVar22 + 4;
        lVar22 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + 4;
        auVar26._8_8_ = lVar22 + 4;
      } while ((lVar15 + 3U & 0xfffffffffffffffc) != uVar17);
      pp_Var13 = (_func_int **)((long)pp_Var13 + uVar11);
    }
    else {
      if (pp_Var14 != pp_Var13) {
        lVar16 = uVar12 - 1;
        auVar19._8_4_ = (int)lVar16;
        auVar19._0_8_ = lVar16;
        auVar19._12_4_ = (int)((ulong)lVar16 >> 0x20);
        lVar16 = result_offset * 4;
        uVar17 = 0;
        auVar25 = auVar8;
        auVar23 = auVar9;
        do {
          auVar24 = auVar19 ^ auVar7;
          auVar26 = auVar25 ^ auVar7;
          iVar21 = auVar24._4_4_;
          if ((bool)(~(iVar21 < auVar26._4_4_ ||
                      auVar24._0_4_ < auVar26._0_4_ && auVar26._4_4_ == iVar21) & 1)) {
            *(undefined4 *)(pdVar5 + uVar17 * 4 + lVar16) = uVar1;
          }
          if (auVar26._12_4_ <= auVar24._12_4_ &&
              (auVar26._8_4_ <= auVar24._8_4_ || auVar26._12_4_ != auVar24._12_4_)) {
            *(undefined4 *)(pdVar5 + uVar17 * 4 + lVar16 + 4) = uVar1;
          }
          iVar27 = SUB164(auVar23 ^ auVar7,4);
          if (iVar27 <= iVar21 && (iVar27 != iVar21 || SUB164(auVar23 ^ auVar7,0) <= auVar24._0_4_))
          {
            *(undefined4 *)(pdVar5 + uVar17 * 4 + lVar16 + 8) = uVar1;
            *(undefined4 *)(pdVar5 + uVar17 * 4 + lVar16 + 0xc) = uVar1;
          }
          uVar17 = uVar17 + 4;
          lVar15 = auVar25._8_8_;
          auVar25._0_8_ = auVar25._0_8_ + 4;
          auVar25._8_8_ = lVar15 + 4;
          lVar15 = auVar23._8_8_;
          auVar23._0_8_ = auVar23._0_8_ + 4;
          auVar23._8_8_ = lVar15 + 4;
        } while ((uVar12 + 3 & 0xfffffffffffffffc) != uVar17);
      }
      result_offset = result_offset + uVar12;
      pSVar10[4]._vptr_SegmentScanState = (_func_int **)((long)pp_Var6 + 1);
      pp_Var13 = (_func_int **)0x0;
    }
    pSVar10[5]._vptr_SegmentScanState = pp_Var13;
  } while (uVar12 <= uVar11);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}